

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O0

type __thiscall
llvm::make_unique<llbuild::buildsystem::StatNode,llvm::StringRef>(llvm *this,StringRef *args)

{
  StatNode *this_00;
  StringRef *args_local;
  
  this_00 = (StatNode *)operator_new(0x20);
  llbuild::buildsystem::StatNode::StatNode(this_00,*args);
  std::
  unique_ptr<llbuild::buildsystem::StatNode,std::default_delete<llbuild::buildsystem::StatNode>>::
  unique_ptr<std::default_delete<llbuild::buildsystem::StatNode>,void>
            ((unique_ptr<llbuild::buildsystem::StatNode,std::default_delete<llbuild::buildsystem::StatNode>>
              *)this,this_00);
  return (__uniq_ptr_data<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::StatNode,_std::default_delete<llbuild::buildsystem::StatNode>,_true,_true>
            )this;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
make_unique(Args &&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}